

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::SSLClient::verify_host_with_common_name(SSLClient *this,X509 *server_cert)

{
  int iVar1;
  char local_2028 [4];
  int name_len;
  char name [8192];
  X509_NAME *subject_name;
  X509 *server_cert_local;
  SSLClient *this_local;
  
  name._8184_8_ = X509_get_subject_name((X509 *)server_cert);
  if (((X509_NAME *)name._8184_8_ == (X509_NAME *)0x0) ||
     (iVar1 = X509_NAME_get_text_by_NID((X509_NAME *)name._8184_8_,0xd,local_2028,0x2000),
     iVar1 == -1)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = check_host_name(this,local_2028,(long)iVar1);
  }
  return this_local._7_1_;
}

Assistant:

inline bool SSLClient::verify_host_with_common_name(X509 * server_cert) const {
        const auto subject_name = X509_get_subject_name(server_cert);

        if (subject_name != nullptr) {
            char name[BUFSIZ];
            auto name_len = X509_NAME_get_text_by_NID(subject_name, NID_commonName,
                name, sizeof(name));

            if (name_len != -1) {
                return check_host_name(name, static_cast<size_t>(name_len));
            }
        }

        return false;
    }